

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *this_00;
  ostream *poVar5;
  bool local_819;
  allocator local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  allocator local_7aa;
  allocator local_7a9;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  allocator local_761;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  allocator local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  undefined1 local_6b8 [8];
  string message;
  undefined1 local_690 [8];
  string oldcwd;
  string currentcwd;
  string local_648;
  char *local_628;
  char *oldDir;
  string local_618;
  allocator local_5f1;
  string local_5f0;
  allocator local_5c9;
  string local_5c8;
  char *local_5a8;
  char *cminor;
  uint v;
  char *local_578;
  char *cmajor;
  undefined1 local_550 [8];
  ostringstream error;
  allocator local_3d1;
  string local_3d0;
  _Self local_3b0;
  _Self local_3a8;
  _Self local_3a0;
  _Self local_398;
  allocator local_389;
  string local_388;
  allocator local_361;
  string local_360;
  undefined1 local_340 [8];
  CacheEntry e;
  string helpString;
  undefined1 local_2b8 [4];
  uint lineno;
  string entryKey;
  string buffer;
  char *realbuffer;
  ifstream fin;
  string local_58 [8];
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *excludes_local;
  bool internal_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = includes;
  std::__cxx11::string::string(local_58,(string *)path);
  std::__cxx11::string::operator+=(local_58,"/CMakeCache.txt");
  if (internal) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&this->Cache);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar4);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&realbuffer,pcVar4,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(entryKey.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_2b8);
      helpString.field_2._12_4_ = 0;
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18))), bVar1)
      {
        std::__cxx11::string::string((string *)&e.Initialized);
        CacheEntry::CacheEntry((CacheEntry *)local_340);
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1);
        helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
        buffer.field_2._8_8_ = std::__cxx11::string::c_str();
        while( true ) {
          bVar1 = false;
          if ((((*(char *)buffer.field_2._8_8_ != '0') &&
               (bVar1 = true, *(char *)buffer.field_2._8_8_ != ' ')) &&
              (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\t')) &&
             (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\r')) {
            bVar1 = *(char *)buffer.field_2._8_8_ == '\n';
          }
          if (!bVar1) break;
          if (*(char *)buffer.field_2._8_8_ == '\n') {
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
          }
          buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
        }
        if ((*(char *)buffer.field_2._8_8_ != '#') && (*(char *)buffer.field_2._8_8_ != '\0')) {
          while( true ) {
            bVar1 = false;
            if (*(char *)buffer.field_2._8_8_ == '/') {
              bVar1 = *(char *)(buffer.field_2._8_8_ + 1) == '/';
            }
            if (!bVar1) break;
            if ((*(char *)(buffer.field_2._8_8_ + 2) == '\\') &&
               (*(char *)(buffer.field_2._8_8_ + 3) == 'n')) {
              std::__cxx11::string::operator+=((string *)&e.Initialized,"\n");
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 4));
            }
            else {
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 2));
            }
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1
                      );
            helpString.field_2._12_4_ = helpString.field_2._12_4_ + 1;
            buffer.field_2._8_8_ = std::__cxx11::string::c_str();
            std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_360,"HELPSTRING",&local_361);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty((CacheEntry *)local_340,&local_360,pcVar4);
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator((allocator<char> *)&local_361);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_388,(char *)buffer.field_2._8_8_,&local_389)
          ;
          bVar1 = cmState::ParseCacheEntry
                            (&local_388,(string *)local_2b8,(string *)local_340,
                             (CacheEntryType *)(e.Value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_388);
          std::allocator<char>::~allocator((allocator<char> *)&local_389);
          if (bVar1) {
            local_398._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(excludes,(key_type *)local_2b8);
            local_3a0._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(excludes);
            bVar1 = std::operator==(&local_398,&local_3a0);
            if (bVar1) {
              local_819 = true;
              if ((!internal) && (local_819 = true, e.Value.field_2._8_4_ == 4)) {
                local_3a8._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)cacheFile.field_2._8_8_,(key_type *)local_2b8);
                local_3b0._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)cacheFile.field_2._8_8_);
                local_819 = std::operator!=(&local_3a8,&local_3b0);
              }
              if (local_819 != false) {
                if (!internal) {
                  e.Value.field_2._8_4_ = 4;
                  std::__cxx11::string::operator=((string *)&e.Initialized,"DO NOT EDIT, ");
                  std::__cxx11::string::operator+=((string *)&e.Initialized,(string *)local_2b8);
                  std::__cxx11::string::operator+=
                            ((string *)&e.Initialized,
                             " loaded from external file.  To change this value edit this file: ");
                  std::__cxx11::string::operator+=((string *)&e.Initialized,(string *)path);
                  std::__cxx11::string::operator+=((string *)&e.Initialized,"/CMakeCache.txt");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_3d0,"HELPSTRING",&local_3d1);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  CacheEntry::SetProperty((CacheEntry *)local_340,&local_3d0,pcVar4);
                  std::__cxx11::string::~string((string *)&local_3d0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
                }
                bVar1 = ReadPropertyEntry(this,(string *)local_2b8,(CacheEntry *)local_340);
                if (!bVar1) {
                  e.Properties.
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                            ::operator[](&this->Cache,(key_type *)local_2b8);
                  CacheEntry::operator=(this_00,(CacheEntry *)local_340);
                }
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_550);
            poVar5 = std::operator<<((ostream *)local_550,"Parse error in cache file ");
            std::operator<<(poVar5,local_58);
            poVar5 = std::operator<<((ostream *)local_550," on line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,helpString.field_2._12_4_);
            poVar5 = std::operator<<(poVar5,". Offending entry: ");
            std::operator<<(poVar5,(char *)buffer.field_2._8_8_);
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string((string *)&cmajor);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_550);
          }
        }
        CacheEntry::~CacheEntry((CacheEntry *)local_340);
        std::__cxx11::string::~string((string *)&e.Initialized);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&v,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)((long)&cminor + 7));
      pcVar4 = GetInitializedCacheValue(this,(string *)&v);
      std::__cxx11::string::~string((string *)&v);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cminor + 7));
      local_578 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5f0,"CMAKE_CACHE_MINOR_VERSION",&local_5f1);
        AddCacheEntry(this,&local_5f0,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_618,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)((long)&oldDir + 7)
                  );
        AddCacheEntry(this,&local_618,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator((allocator<char> *)((long)&oldDir + 7));
      }
      else {
        cminor._0_4_ = 0;
        iVar3 = __isoc99_sscanf(pcVar4,"%u",&cminor);
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)cminor;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5c8,"CMAKE_CACHE_MINOR_VERSION",&local_5c9);
        pcVar4 = GetInitializedCacheValue(this,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
        local_5a8 = pcVar4;
        if ((pcVar4 != (char *)0x0) && (iVar3 = __isoc99_sscanf(pcVar4,"%u",&cminor), iVar3 == 1)) {
          this->CacheMinorVersion = (uint)cminor;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_648,"CMAKE_CACHEFILE_DIR",
                 (allocator *)(currentcwd.field_2._M_local_buf + 0xf));
      pcVar4 = GetInitializedCacheValue(this,&local_648);
      std::__cxx11::string::~string((string *)&local_648);
      std::allocator<char>::~allocator((allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      local_628 = pcVar4;
      if ((internal) && (pcVar4 != (char *)0x0)) {
        std::__cxx11::string::string((string *)(oldcwd.field_2._M_local_buf + 8),(string *)path);
        pcVar4 = local_628;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_690,pcVar4,(allocator *)(message.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&oldcwd.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)(oldcwd.field_2._M_local_buf + 8),"/CMakeCache.txt");
        std::__cxx11::string::operator+=((string *)local_690,"/CMakeCache.txt");
        bVar1 = cmsys::SystemTools::SameFile
                          ((string *)local_690,(string *)((long)&oldcwd.field_2 + 8));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_738,"The current CMakeCache.txt directory ",&local_739);
          std::operator+(&local_718,&local_738,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&oldcwd.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_760," is different than the directory ",&local_761);
          std::operator+(&local_6f8,&local_718,&local_760);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_7a8,"CMAKE_CACHEFILE_DIR",&local_7a9);
          pcVar4 = GetInitializedCacheValue(this,&local_7a8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_788,pcVar4,&local_7aa);
          std::operator+(&local_6d8,&local_6f8,&local_788);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_7d0,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,&local_7d1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_6b8,&local_6d8,&local_7d0);
          std::__cxx11::string::~string((string *)&local_7d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::__cxx11::string::~string((string *)&local_788);
          std::allocator<char>::~allocator((allocator<char> *)&local_7aa);
          std::__cxx11::string::~string((string *)&local_7a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_760);
          std::allocator<char>::~allocator((allocator<char> *)&local_761);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_738);
          std::allocator<char>::~allocator((allocator<char> *)&local_739);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)local_6b8);
        }
        std::__cxx11::string::~string((string *)local_690);
        std::__cxx11::string::~string((string *)(oldcwd.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)(entryKey.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = false;
    }
    std::ifstream::~ifstream(&realbuffer);
  }
  else {
    CleanCMakeFiles(this,path);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile.c_str())) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str().c_str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const char* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor, "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const char* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor, "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      std::string message =
        std::string("The current CMakeCache.txt directory ") + currentcwd +
        std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
    }
  }
  return true;
}